

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O0

void GUIRender(HGUI handle)

{
  int iVar1;
  mu_Command *local_38;
  mu_Command *cmd;
  double y;
  double x;
  GLFWwindow *window;
  GUI *gui;
  HGUI handle_local;
  
  x = *(double *)((long)handle + 0x18);
  window = (GLFWwindow *)handle;
  gui = (GUI *)handle;
  glfwGetCursorPos((GLFWwindow *)x,&y,(double *)&cmd);
  mu_input_mousemove(*(mu_Context **)(window + 0x10),(int)y,(int)(double)cmd);
  *(int *)(window + 0x1a0ca0) = (int)y;
  *(int *)(window + 0x1a0ca4) = (int)(double)cmd;
  local_38 = (mu_Command *)0x0;
  while (iVar1 = mu_next_command(*(mu_Context **)(window + 0x10),&local_38), iVar1 != 0) {
    switch(local_38->type) {
    case 2:
      ClipRect((GUI *)window,(local_38->clip).rect);
      break;
    case 3:
      DrawRect((GUI *)window,(local_38->clip).rect,(local_38->rect).color);
      break;
    case 4:
      DrawText((GUI *)window,(local_38->text).str,(local_38->text).pos,(local_38->rect).color);
      break;
    case 5:
      DrawIcon((GUI *)window,(local_38->icon).id,(local_38->clip).rect,(local_38->icon).color);
    }
  }
  Render((GUI *)window);
  return;
}

Assistant:

void GUIRender(HGUI handle) {
    GUI* gui = (GUI*)handle;
    GLFWwindow* window = gui->Window;

    double x, y;
    glfwGetCursorPos(window, &x, &y);
    mu_input_mousemove(gui->Ctx, x, y);
    gui->CursorX = x;
    gui->CursorY = y;

    mu_Command *cmd = NULL;
    while (mu_next_command(gui->Ctx, &cmd)) {
        switch (cmd->type) {
            case MU_COMMAND_TEXT: DrawText(gui, cmd->text.str, cmd->text.pos, cmd->text.color); break;
            case MU_COMMAND_RECT: DrawRect(gui, cmd->rect.rect, cmd->rect.color); break;
            case MU_COMMAND_ICON: DrawIcon(gui, cmd->icon.id, cmd->icon.rect, cmd->icon.color); break;
            case MU_COMMAND_CLIP: ClipRect(gui, cmd->clip.rect); break;
        }
    }

    Render(gui);
}